

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::StopNodes(CConnman *this)

{
  list<CNode_*,_std::allocator<CNode_*>_> *this_00;
  pointer ppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  CNode *this_01;
  pointer ppCVar4;
  iterator __end1;
  _List_node_base *p_Var5;
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> anchors_to_dump;
  vector<CAddress,_std::allocator<CAddress>_> local_a0;
  path local_88;
  undefined1 local_60 [8];
  bool local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fAddressesInitialized == true) {
    DumpAddresses(this);
    this->fAddressesInitialized = false;
    if (this->m_use_addrman_outgoing == true) {
      GetCurrentBlockRelayOnlyConns(&local_a0,this);
      if (2 < (ulong)(((long)local_a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)) {
        std::vector<CAddress,_std::allocator<CAddress>_>::resize(&local_a0,2);
      }
      ArgsManager::GetDataDir((path *)&local_88,&gArgs,true);
      std::filesystem::__cxx11::path::_M_append(&local_88,0xb,"anchors.dat");
      std::filesystem::__cxx11::path::path((path *)local_60,&local_88);
      DumpAnchors((path *)local_60,&local_a0);
      std::filesystem::__cxx11::path::~path((path *)local_60);
      std::filesystem::__cxx11::path::~path(&local_88);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_a0);
    }
  }
  local_60 = (undefined1  [8])&this->m_nodes_mutex;
  local_58 = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_60);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_60);
  for (ppCVar4 = ppCVar1; ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1) {
    this_01 = *ppCVar4;
    CNode::CloseSocketDisconnect(this_01);
    (*this->m_msgproc->_vptr_NetEventsInterface[1])(this->m_msgproc,this_01);
    CNode::~CNode(this_01);
    operator_delete(this_01,0x3a8);
  }
  this_00 = &this->m_nodes_disconnected;
  p_Var5 = (_List_node_base *)this_00;
  while (p_Var5 = (((_List_base<CNode_*,_std::allocator<CNode_*>_> *)&p_Var5->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var5 != (_List_node_base *)this_00) {
    DeleteNode(this,(CNode *)p_Var5[1]._M_next);
  }
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::clear(this_00);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::clear
            (&this->vhListenSocket);
  std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semOutbound,
             (pointer)0x0);
  std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semAddnode,
             (pointer)0x0);
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)ppCVar3 - (long)ppCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::StopNodes()
{
    if (fAddressesInitialized) {
        DumpAddresses();
        fAddressesInitialized = false;

        if (m_use_addrman_outgoing) {
            // Anchor connections are only dumped during clean shutdown.
            std::vector<CAddress> anchors_to_dump = GetCurrentBlockRelayOnlyConns();
            if (anchors_to_dump.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
                anchors_to_dump.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
            }
            DumpAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME, anchors_to_dump);
        }
    }

    // Delete peer connections.
    std::vector<CNode*> nodes;
    WITH_LOCK(m_nodes_mutex, nodes.swap(m_nodes));
    for (CNode* pnode : nodes) {
        pnode->CloseSocketDisconnect();
        DeleteNode(pnode);
    }

    for (CNode* pnode : m_nodes_disconnected) {
        DeleteNode(pnode);
    }
    m_nodes_disconnected.clear();
    vhListenSocket.clear();
    semOutbound.reset();
    semAddnode.reset();
}